

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O1

void anon_unknown.dwarf_29a798::writeRead
               (Array2D<unsigned_int> *pi1,Array2D<half> *ph1,Array2D<float> *pf1,char *fileName,
               LineOrder lorder,int width,int height,int xSize,int ySize,int xOffset,int yOffset,
               Compression comp,LevelMode mode,LevelRoundingMode rmode)

{
  float *pfVar1;
  size_t sVar2;
  float fVar3;
  LineOrder LVar4;
  Compression CVar5;
  bool bVar6;
  uint dy;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ostream *poVar13;
  long *plVar14;
  LineOrder *pLVar15;
  Compression *pCVar16;
  ChannelList *pCVar17;
  Header *pHVar18;
  Box2i *pBVar19;
  void *pvVar20;
  void *pvVar21;
  void *pvVar22;
  Box2i *pBVar23;
  float *pfVar24;
  V2f *pVVar25;
  V2f *pVVar26;
  iterator iVar27;
  const_iterator cVar28;
  Iterator IVar29;
  ConstIterator CVar30;
  long lVar31;
  undefined4 uVar32;
  long lVar33;
  ulong uVar34;
  undefined8 uVar35;
  long lVar36;
  uint *puVar37;
  int tileY;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  int tileX_2;
  uint uVar41;
  void *pvVar42;
  char *b;
  long lVar43;
  half *phVar44;
  undefined1 uVar45;
  ulong in_R10;
  int tileX;
  long lVar46;
  void *pvVar47;
  char *b_00;
  int level;
  ulong uVar48;
  long lVar49;
  void *pvVar50;
  int tileX_1;
  ulong uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar64;
  int iVar65;
  InputFile in;
  char *local_158;
  int local_138;
  int local_128;
  int local_120;
  FrameBuffer fb;
  TiledOutputFile out;
  Header hdr;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode ",10);
  poVar13 = (ostream *)std::ostream::operator<<(&std::cout,xOffset);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", roundingMode ",0xf);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,yOffset);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", line order ",0xd);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,lorder);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,",\ntileSize ",0xb);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"x",1);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", xOffset ",10);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,xSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", yOffset ",10);
  plVar14 = (long *)std::ostream::operator<<(poVar13,ySize);
  std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  std::ostream::put((char)plVar14);
  std::ostream::flush();
  out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
  out._data = (Data *)0x500000002f;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = xSize + 0x2f;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = ySize + 0x50;
  fb._map._M_t._M_impl._0_4_ = xSize;
  fb._map._M_t._M_impl._4_4_ = ySize;
  in.super_GenericInputFile._vptr_GenericInputFile = (_func_int **)0x0;
  Imf_2_5::Header::Header
            (&hdr,(Box2i *)&out,(Box2i *)&fb,1.0,(V2f *)&in,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pLVar15 = Imf_2_5::Header::lineOrder(&hdr);
  *pLVar15 = lorder;
  pCVar16 = Imf_2_5::Header::compression(&hdr);
  *pCVar16 = ZIP_COMPRESSION;
  pCVar17 = Imf_2_5::Header::channels(&hdr);
  Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
  Imf_2_5::ChannelList::insert(pCVar17,"I",(Channel *)&out);
  pCVar17 = Imf_2_5::Header::channels(&hdr);
  Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_2_5::ChannelList::insert(pCVar17,"H",(Channel *)&out);
  pCVar17 = Imf_2_5::Header::channels(&hdr);
  Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
  Imf_2_5::ChannelList::insert(pCVar17,"F",(Channel *)&out);
  out.super_GenericOutputFile._vptr_GenericOutputFile._4_4_ = height;
  out.super_GenericOutputFile._vptr_GenericOutputFile._0_4_ = width;
  out._data = (Data *)CONCAT44(yOffset,xOffset);
  Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar39 = (ulong)(uint)-ySize;
  uVar34 = (ulong)(uint)-xSize;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_2_5::Slice::Slice
            ((Slice *)&out,UINT,(char *)(pi1->_data + pi1->_sizeY * uVar39 + uVar34),4,0xc0,1,1,0.0,
             SUB81(in_R10,0),false);
  Imf_2_5::FrameBuffer::insert(&fb,"I",(Slice *)&out);
  Imf_2_5::Slice::Slice
            ((Slice *)&out,HALF,(char *)(ph1->_data + ph1->_sizeY * uVar39 + uVar34),2,0x60,1,1,0.0,
             SUB81(in_R10,0),false);
  Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
  Imf_2_5::Slice::Slice
            ((Slice *)&out,FLOAT,(char *)(pf1->_data + uVar39 * pf1->_sizeY + uVar34),4,0xc0,1,1,0.0
             ,SUB81(in_R10,0),false);
  Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
  std::ostream::flush();
  remove(fileName);
  iVar7 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledOutputFile::TiledOutputFile(&out,fileName,&hdr,iVar7);
  Imf_2_5::TiledOutputFile::setFrameBuffer(&out,&fb);
  if (xOffset == 0) {
    if (lorder == DECREASING_Y) {
      iVar7 = Imf_2_5::TiledOutputFile::numYTiles(&out,0);
      iVar7 = iVar7 + -1;
      iVar10 = -1;
      iVar8 = -1;
    }
    else {
      iVar7 = 0;
      iVar8 = Imf_2_5::TiledOutputFile::numYTiles(&out,0);
      iVar10 = 1;
    }
    if (iVar7 != iVar8) {
      do {
        for (iVar64 = 0; iVar65 = Imf_2_5::TiledOutputFile::numXTiles(&out,0), iVar64 < iVar65;
            iVar64 = iVar64 + 1) {
          Imf_2_5::TiledOutputFile::writeTile(&out,iVar64,iVar7,0);
        }
        iVar7 = iVar7 + iVar10;
      } while (iVar7 != iVar8);
    }
  }
  else if (xOffset == 1) {
    uVar41 = -(uint)(lorder == DECREASING_Y);
    uVar38 = uVar41 | 1;
    uVar9 = 0xffffffff;
    for (iVar7 = 0; iVar8 = Imf_2_5::TiledOutputFile::numLevels(&out), iVar7 < iVar8;
        iVar7 = iVar7 + 1) {
      if (lorder == DECREASING_Y) {
        iVar8 = Imf_2_5::TiledOutputFile::numYTiles(&out,iVar7);
        uVar41 = iVar8 - 1;
        dy = uVar41;
      }
      else {
        uVar9 = Imf_2_5::TiledOutputFile::numYTiles(&out,iVar7);
        dy = uVar41;
      }
      for (; dy != uVar9; dy = dy + uVar38) {
        for (iVar8 = 0; iVar10 = Imf_2_5::TiledOutputFile::numXTiles(&out,iVar7), iVar8 < iVar10;
            iVar8 = iVar8 + 1) {
          Imf_2_5::TiledOutputFile::writeTile(&out,iVar8,dy,iVar7);
        }
      }
    }
  }
  else {
    for (iVar7 = 0; iVar8 = Imf_2_5::TiledOutputFile::numYLevels(&out), iVar7 < iVar8;
        iVar7 = iVar7 + 1) {
      if (lorder == DECREASING_Y) {
        iVar8 = Imf_2_5::TiledOutputFile::numYTiles(&out,iVar7);
        iVar8 = iVar8 + -1;
        local_158._0_4_ = -1;
        iVar10 = -1;
      }
      else {
        iVar10 = Imf_2_5::TiledOutputFile::numYTiles(&out,iVar7);
        iVar8 = 0;
        local_158._0_4_ = 1;
      }
      for (iVar64 = 0; iVar11 = Imf_2_5::TiledOutputFile::numXLevels(&out), iVar65 = iVar8,
          iVar64 < iVar11; iVar64 = iVar64 + 1) {
        for (; iVar65 != iVar10; iVar65 = iVar65 + (int)local_158) {
          for (iVar11 = 0; iVar12 = Imf_2_5::TiledOutputFile::numXTiles(&out,iVar64),
              iVar11 < iVar12; iVar11 = iVar11 + 1) {
            Imf_2_5::TiledOutputFile::writeTile(&out,iVar11,iVar65,iVar64,iVar7);
          }
        }
      }
    }
  }
  Imf_2_5::TiledOutputFile::~TiledOutputFile(&out);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&fb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," reading INCREASING_Y",0x15);
  std::ostream::flush();
  iVar7 = Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile(&in,fileName,iVar7);
  pHVar18 = Imf_2_5::InputFile::header(&in);
  pBVar19 = Imf_2_5::Header::dataWindow(pHVar18);
  lVar46 = (long)(pBVar19->min).x;
  lVar33 = (pBVar19->max).x - lVar46;
  uVar34 = lVar33 + 1;
  iVar7 = (pBVar19->max).y;
  iVar8 = (pBVar19->min).y;
  lVar43 = (long)iVar7 - (long)iVar8;
  uVar51 = (lVar43 + 1) * uVar34;
  uVar48 = -(ulong)(uVar51 >> 0x3e != 0) | uVar51 * 4;
  pvVar20 = operator_new__(uVar48);
  uVar39 = 0xffffffffffffffff;
  if (-1 < (long)uVar51) {
    uVar39 = uVar51 * 2;
  }
  pvVar21 = operator_new__(uVar39);
  pvVar22 = operator_new__(uVar48);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar49 = -(long)iVar8 * uVar34;
  sVar2 = uVar34 * 4;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_2_5::Slice::Slice
            ((Slice *)&out,UINT,(char *)((long)pvVar20 + lVar46 * -4 + lVar49 * 4),4,sVar2,1,1,0.0,
             SUB81(in_R10,0),false);
  Imf_2_5::FrameBuffer::insert(&fb,"I",(Slice *)&out);
  Imf_2_5::Slice::Slice
            ((Slice *)&out,HALF,(char *)((long)pvVar21 + lVar46 * -2 + lVar49 * 2),2,uVar34 * 2,1,1,
             0.0,SUB81(in_R10,0),false);
  Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
  uVar35 = 4;
  Imf_2_5::Slice::Slice
            ((Slice *)&out,FLOAT,(char *)((long)pvVar22 + lVar46 * -4 + lVar49 * 4),4,sVar2,1,1,0.0,
             SUB81(in_R10,0),false);
  Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
  Imf_2_5::InputFile::setFrameBuffer(&in,&fb);
  uVar32 = (undefined4)uVar35;
  iVar10 = (pBVar19->min).y;
  if (iVar10 <= (pBVar19->max).y) {
    do {
      Imf_2_5::InputFile::readPixels(&in,iVar10);
      uVar32 = (undefined4)uVar35;
      bVar6 = iVar10 < (pBVar19->max).y;
      iVar10 = iVar10 + 1;
    } while (bVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
  std::ostream::flush();
  pHVar18 = Imf_2_5::InputFile::header(&in);
  pBVar19 = Imf_2_5::Header::displayWindow(pHVar18);
  pBVar23 = Imf_2_5::Header::displayWindow(&hdr);
  iVar10 = -(uint)((pBVar23->min).x == (pBVar19->min).x);
  iVar64 = -(uint)((pBVar23->min).y == (pBVar19->min).y);
  auVar52._4_4_ = iVar10;
  auVar52._0_4_ = iVar10;
  auVar52._8_4_ = iVar64;
  auVar52._12_4_ = iVar64;
  iVar10 = movmskpd(uVar32,auVar52);
  if ((iVar10 != 3) ||
     (iVar64 = -(uint)((pBVar23->max).x == (pBVar19->max).x),
     iVar65 = -(uint)((pBVar23->max).y == (pBVar19->max).y), auVar53._4_4_ = iVar64,
     auVar53._0_4_ = iVar64, auVar53._8_4_ = iVar65, auVar53._12_4_ = iVar65,
     iVar64 = movmskpd((int)pBVar23,auVar53), iVar64 != 3)) {
    __assert_fail("in.header().displayWindow() == hdr.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x127,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar18 = Imf_2_5::InputFile::header(&in);
  pBVar19 = Imf_2_5::Header::dataWindow(pHVar18);
  pBVar23 = Imf_2_5::Header::dataWindow(&hdr);
  iVar64 = -(uint)((pBVar23->min).x == (pBVar19->min).x);
  iVar65 = -(uint)((pBVar23->min).y == (pBVar19->min).y);
  auVar54._4_4_ = iVar64;
  auVar54._0_4_ = iVar64;
  auVar54._8_4_ = iVar65;
  auVar54._12_4_ = iVar65;
  iVar10 = movmskpd(iVar10,auVar54);
  if ((iVar10 != 3) ||
     (iVar10 = -(uint)((pBVar23->max).x == (pBVar19->max).x),
     iVar64 = -(uint)((pBVar23->max).y == (pBVar19->max).y), auVar55._4_4_ = iVar10,
     auVar55._0_4_ = iVar10, auVar55._8_4_ = iVar64, auVar55._12_4_ = iVar64,
     iVar10 = movmskpd((int)pBVar23,auVar55), iVar10 != 3)) {
    __assert_fail("in.header().dataWindow() == hdr.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x128,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar18 = Imf_2_5::InputFile::header(&in);
  pfVar24 = Imf_2_5::Header::pixelAspectRatio(pHVar18);
  fVar3 = *pfVar24;
  pfVar24 = Imf_2_5::Header::pixelAspectRatio(&hdr);
  if ((fVar3 != *pfVar24) || (NAN(fVar3) || NAN(*pfVar24))) {
    __assert_fail("in.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x129,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar18 = Imf_2_5::InputFile::header(&in);
  pVVar25 = Imf_2_5::Header::screenWindowCenter(pHVar18);
  pVVar26 = Imf_2_5::Header::screenWindowCenter(&hdr);
  if ((((pVVar25->x != pVVar26->x) || (NAN(pVVar25->x) || NAN(pVVar26->x))) ||
      (pVVar25->y != pVVar26->y)) || (NAN(pVVar25->y) || NAN(pVVar26->y))) {
    __assert_fail("in.header().screenWindowCenter() == hdr.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x12a,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar18 = Imf_2_5::InputFile::header(&in);
  pfVar24 = Imf_2_5::Header::screenWindowWidth(pHVar18);
  fVar3 = *pfVar24;
  pfVar24 = Imf_2_5::Header::screenWindowWidth(&hdr);
  if ((fVar3 != *pfVar24) || (NAN(fVar3) || NAN(*pfVar24))) {
    __assert_fail("in.header().screenWindowWidth() == hdr.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,299,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar18 = Imf_2_5::InputFile::header(&in);
  pLVar15 = Imf_2_5::Header::lineOrder(pHVar18);
  LVar4 = *pLVar15;
  pLVar15 = Imf_2_5::Header::lineOrder(&hdr);
  if (LVar4 != *pLVar15) {
    __assert_fail("in.header().lineOrder() == hdr.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,300,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar18 = Imf_2_5::InputFile::header(&in);
  pCVar16 = Imf_2_5::Header::compression(pHVar18);
  CVar5 = *pCVar16;
  pCVar16 = Imf_2_5::Header::compression(&hdr);
  if (CVar5 != *pCVar16) {
    __assert_fail("in.header().compression() == hdr.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x12d,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pCVar17 = Imf_2_5::Header::channels(&hdr);
  iVar27._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar17);
  pHVar18 = Imf_2_5::InputFile::header(&in);
  pCVar17 = Imf_2_5::Header::channels(pHVar18);
  cVar28._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar17);
  while( true ) {
    pCVar17 = Imf_2_5::Header::channels(&hdr);
    IVar29 = Imf_2_5::ChannelList::end(pCVar17);
    if ((iterator)iVar27._M_node == IVar29._i._M_node) {
      pHVar18 = Imf_2_5::InputFile::header(&in);
      pCVar17 = Imf_2_5::Header::channels(pHVar18);
      CVar30 = Imf_2_5::ChannelList::end(pCVar17);
      if ((const_iterator)cVar28._M_node != CVar30._i._M_node) {
        __assert_fail("ii == in.header().channels().end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x13d,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      local_128 = (int)lVar43;
      if (-1 < local_128) {
        puVar37 = pi1->_data;
        phVar44 = ph1->_data;
        pfVar24 = pf1->_data;
        in_R10 = 0;
        pvVar42 = pvVar22;
        pvVar47 = pvVar21;
        pvVar50 = pvVar20;
        do {
          local_120 = (int)lVar33;
          if (-1 < local_120) {
            uVar39 = 0;
            do {
              if (puVar37[uVar39] != *(uint *)((long)pvVar50 + uVar39 * 4)) {
                __assert_fail("pi1[y][x] == pi2[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                              ,0x143,
                              "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                             );
              }
              fVar3 = *(float *)((long)&half::_toFloat + (ulong)phVar44[uVar39]._h * 4);
              pfVar1 = (float *)((long)&half::_toFloat +
                                (ulong)*(ushort *)((long)pvVar47 + uVar39 * 2) * 4);
              if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) {
                __assert_fail("ph1[y][x] == ph2[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                              ,0x144,
                              "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                             );
              }
              pfVar1 = (float *)((long)pvVar42 + uVar39 * 4);
              if ((pfVar24[uVar39] != *pfVar1) || (NAN(pfVar24[uVar39]) || NAN(*pfVar1))) {
                __assert_fail("pf1[y][x] == pf2[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                              ,0x145,
                              "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                             );
              }
              uVar39 = uVar39 + 1;
            } while ((uVar34 & 0xffffffff) != uVar39);
          }
          in_R10 = in_R10 + 1;
          pvVar42 = (void *)((long)pvVar42 + sVar2);
          pfVar24 = pfVar24 + pf1->_sizeY;
          pvVar47 = (void *)((long)pvVar47 + uVar34 * 2);
          phVar44 = phVar44 + ph1->_sizeY;
          pvVar50 = (void *)((long)pvVar50 + sVar2);
          puVar37 = puVar37 + pi1->_sizeY;
        } while (in_R10 != (iVar7 - iVar8) + 1);
      }
      uVar45 = (undefined1)in_R10;
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      operator_delete__(pvVar22);
      operator_delete__(pvVar21);
      operator_delete__(pvVar20);
      Imf_2_5::InputFile::~InputFile(&in);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      poVar13 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"         reading DECREASING_Y",0x1d);
      std::ostream::flush();
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile(&in,fileName,iVar7);
      pHVar18 = Imf_2_5::InputFile::header(&in);
      pBVar19 = Imf_2_5::Header::dataWindow(pHVar18);
      lVar46 = (long)(pBVar19->min).x;
      lVar33 = (pBVar19->max).x - lVar46;
      uVar34 = lVar33 + 1;
      iVar7 = (pBVar19->max).y;
      iVar8 = (pBVar19->min).y;
      lVar43 = (long)iVar7 - (long)iVar8;
      uVar48 = (lVar43 + 1) * uVar34;
      uVar39 = uVar48 * 4;
      if (0x3fffffffffffffff < uVar48) {
        uVar39 = 0xffffffffffffffff;
      }
      pvVar20 = operator_new__(uVar39);
      uVar51 = 0xffffffffffffffff;
      if (-1 < (long)uVar48) {
        uVar51 = uVar48 * 2;
      }
      pvVar21 = operator_new__(uVar51);
      pvVar22 = operator_new__(uVar39);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar49 = -(long)iVar8 * uVar34;
      sVar2 = uVar34 * 4;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,(char *)((long)pvVar20 + lVar46 * -4 + lVar49 * 4),4,sVar2,1,1,
                 0.0,(bool)uVar45,false);
      Imf_2_5::FrameBuffer::insert(&fb,"I",(Slice *)&out);
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)((long)pvVar21 + lVar46 * -2 + lVar49 * 2),2,uVar34 * 2,
                 1,1,0.0,(bool)uVar45,false);
      Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
      uVar35 = 4;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,(char *)((long)pvVar22 + lVar46 * -4 + lVar49 * 4),4,sVar2,1,1,
                 0.0,(bool)uVar45,false);
      Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
      Imf_2_5::InputFile::setFrameBuffer(&in,&fb);
      uVar32 = (undefined4)uVar35;
      iVar10 = (pBVar19->max).y;
      if ((pBVar19->min).y <= iVar10) {
        do {
          Imf_2_5::InputFile::readPixels(&in,iVar10);
          uVar32 = (undefined4)uVar35;
          bVar6 = (pBVar19->min).y < iVar10;
          iVar10 = iVar10 + -1;
        } while (bVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      pHVar18 = Imf_2_5::InputFile::header(&in);
      pBVar19 = Imf_2_5::Header::displayWindow(pHVar18);
      pBVar23 = Imf_2_5::Header::displayWindow(&hdr);
      iVar10 = -(uint)((pBVar23->min).x == (pBVar19->min).x);
      iVar64 = -(uint)((pBVar23->min).y == (pBVar19->min).y);
      auVar56._4_4_ = iVar10;
      auVar56._0_4_ = iVar10;
      auVar56._8_4_ = iVar64;
      auVar56._12_4_ = iVar64;
      iVar10 = movmskpd(uVar32,auVar56);
      if ((iVar10 != 3) ||
         (iVar64 = -(uint)((pBVar23->max).x == (pBVar19->max).x),
         iVar65 = -(uint)((pBVar23->max).y == (pBVar19->max).y), auVar57._4_4_ = iVar64,
         auVar57._0_4_ = iVar64, auVar57._8_4_ = iVar65, auVar57._12_4_ = iVar65,
         iVar64 = movmskpd((int)pBVar23,auVar57), iVar64 != 3)) {
        __assert_fail("in.header().displayWindow() == hdr.displayWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x176,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pHVar18 = Imf_2_5::InputFile::header(&in);
      pBVar19 = Imf_2_5::Header::dataWindow(pHVar18);
      pBVar23 = Imf_2_5::Header::dataWindow(&hdr);
      iVar64 = -(uint)((pBVar23->min).x == (pBVar19->min).x);
      iVar65 = -(uint)((pBVar23->min).y == (pBVar19->min).y);
      auVar58._4_4_ = iVar64;
      auVar58._0_4_ = iVar64;
      auVar58._8_4_ = iVar65;
      auVar58._12_4_ = iVar65;
      iVar10 = movmskpd(iVar10,auVar58);
      if ((iVar10 != 3) ||
         (iVar10 = -(uint)((pBVar23->max).x == (pBVar19->max).x),
         iVar64 = -(uint)((pBVar23->max).y == (pBVar19->max).y), auVar59._4_4_ = iVar10,
         auVar59._0_4_ = iVar10, auVar59._8_4_ = iVar64, auVar59._12_4_ = iVar64,
         iVar10 = movmskpd((int)pBVar23,auVar59), iVar10 != 3)) {
        __assert_fail("in.header().dataWindow() == hdr.dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x177,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pHVar18 = Imf_2_5::InputFile::header(&in);
      pfVar24 = Imf_2_5::Header::pixelAspectRatio(pHVar18);
      fVar3 = *pfVar24;
      pfVar24 = Imf_2_5::Header::pixelAspectRatio(&hdr);
      if ((fVar3 != *pfVar24) || (NAN(fVar3) || NAN(*pfVar24))) {
        __assert_fail("in.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x178,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pHVar18 = Imf_2_5::InputFile::header(&in);
      pVVar25 = Imf_2_5::Header::screenWindowCenter(pHVar18);
      pVVar26 = Imf_2_5::Header::screenWindowCenter(&hdr);
      if ((((pVVar25->x != pVVar26->x) || (NAN(pVVar25->x) || NAN(pVVar26->x))) ||
          (pVVar25->y != pVVar26->y)) || (NAN(pVVar25->y) || NAN(pVVar26->y))) {
        __assert_fail("in.header().screenWindowCenter() == hdr.screenWindowCenter()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x179,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pHVar18 = Imf_2_5::InputFile::header(&in);
      pfVar24 = Imf_2_5::Header::screenWindowWidth(pHVar18);
      fVar3 = *pfVar24;
      pfVar24 = Imf_2_5::Header::screenWindowWidth(&hdr);
      if ((fVar3 != *pfVar24) || (NAN(fVar3) || NAN(*pfVar24))) {
        __assert_fail("in.header().screenWindowWidth() == hdr.screenWindowWidth()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x17a,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pHVar18 = Imf_2_5::InputFile::header(&in);
      pLVar15 = Imf_2_5::Header::lineOrder(pHVar18);
      LVar4 = *pLVar15;
      pLVar15 = Imf_2_5::Header::lineOrder(&hdr);
      if (LVar4 != *pLVar15) {
        __assert_fail("in.header().lineOrder() == hdr.lineOrder()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x17b,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pHVar18 = Imf_2_5::InputFile::header(&in);
      pCVar16 = Imf_2_5::Header::compression(pHVar18);
      CVar5 = *pCVar16;
      pCVar16 = Imf_2_5::Header::compression(&hdr);
      if (CVar5 != *pCVar16) {
        __assert_fail("in.header().compression() == hdr.compression()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x17c,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pCVar17 = Imf_2_5::Header::channels(&hdr);
      iVar27._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar17);
      pHVar18 = Imf_2_5::InputFile::header(&in);
      pCVar17 = Imf_2_5::Header::channels(pHVar18);
      cVar28._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar17);
      while( true ) {
        pCVar17 = Imf_2_5::Header::channels(&hdr);
        IVar29 = Imf_2_5::ChannelList::end(pCVar17);
        if ((iterator)iVar27._M_node == IVar29._i._M_node) {
          pHVar18 = Imf_2_5::InputFile::header(&in);
          pCVar17 = Imf_2_5::Header::channels(pHVar18);
          CVar30 = Imf_2_5::ChannelList::end(pCVar17);
          if ((const_iterator)cVar28._M_node != CVar30._i._M_node) {
            __assert_fail("ii == in.header().channels().end()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x18c,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
          local_128 = (int)lVar43;
          if (-1 < local_128) {
            puVar37 = pi1->_data;
            phVar44 = ph1->_data;
            pfVar24 = pf1->_data;
            uVar39 = 0;
            pvVar42 = pvVar22;
            pvVar47 = pvVar21;
            pvVar50 = pvVar20;
            do {
              local_120 = (int)lVar33;
              if (-1 < local_120) {
                uVar48 = 0;
                do {
                  if (puVar37[uVar48] != *(uint *)((long)pvVar50 + uVar48 * 4)) {
                    __assert_fail("pi1[y][x] == pi2[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                  ,0x192,
                                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                 );
                  }
                  fVar3 = *(float *)((long)&half::_toFloat + (ulong)phVar44[uVar48]._h * 4);
                  pfVar1 = (float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)((long)pvVar47 + uVar48 * 2) * 4);
                  if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) {
                    __assert_fail("ph1[y][x] == ph2[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                  ,0x193,
                                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                 );
                  }
                  pfVar1 = (float *)((long)pvVar42 + uVar48 * 4);
                  if ((pfVar24[uVar48] != *pfVar1) || (NAN(pfVar24[uVar48]) || NAN(*pfVar1))) {
                    __assert_fail("pf1[y][x] == pf2[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                  ,0x194,
                                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                 );
                  }
                  uVar48 = uVar48 + 1;
                } while ((uVar34 & 0xffffffff) != uVar48);
              }
              uVar39 = uVar39 + 1;
              pvVar42 = (void *)((long)pvVar42 + sVar2);
              pfVar24 = pfVar24 + pf1->_sizeY;
              pvVar47 = (void *)((long)pvVar47 + uVar34 * 2);
              phVar44 = phVar44 + ph1->_sizeY;
              pvVar50 = (void *)((long)pvVar50 + sVar2);
              puVar37 = puVar37 + pi1->_sizeY;
            } while (uVar39 != (iVar7 - iVar8) + 1);
          }
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)&fb);
          operator_delete__(pvVar22);
          operator_delete__(pvVar21);
          operator_delete__(pvVar20);
          Imf_2_5::InputFile::~InputFile(&in);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar13 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,"         reading INCREASING_Y (new frame buffer on every line)",0x3e);
          std::ostream::flush();
          iVar7 = Imf_2_5::globalThreadCount();
          Imf_2_5::InputFile::InputFile(&in,fileName,iVar7);
          pHVar18 = Imf_2_5::InputFile::header(&in);
          pBVar19 = Imf_2_5::Header::dataWindow(pHVar18);
          lVar49 = (long)(pBVar19->min).x;
          lVar43 = (pBVar19->max).x - lVar49;
          uVar39 = lVar43 + 1;
          iVar7 = (pBVar19->max).y;
          lVar33 = (long)iVar7;
          iVar8 = (pBVar19->min).y;
          lVar46 = lVar33 - iVar8;
          uVar48 = (lVar46 + 1) * uVar39;
          uVar34 = uVar48 * 4;
          if (0x3fffffffffffffff < uVar48) {
            uVar34 = 0xffffffffffffffff;
          }
          pvVar20 = operator_new__(uVar34);
          uVar51 = 0xffffffffffffffff;
          if (-1 < (long)uVar48) {
            uVar51 = uVar48 * 2;
          }
          pvVar21 = operator_new__(uVar51);
          pvVar22 = operator_new__(uVar34);
          iVar10 = (pBVar19->min).y;
          if (iVar10 <= (pBVar19->max).y) {
            lVar40 = (long)iVar10 + -1;
            lVar31 = ((long)iVar10 - (long)iVar8) * uVar39;
            lVar36 = lVar31 * 4 + lVar49 * -4;
            local_158 = (char *)((long)pvVar22 + lVar36);
            lVar33 = uVar39 * 4;
            b = (char *)((long)pvVar21 + lVar31 * 2 + lVar49 * -2);
            b_00 = (char *)((long)pvVar20 + lVar36);
            do {
              uVar45 = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_2_5::Slice::Slice
                        ((Slice *)&out,UINT,b_00,4,0,1,1,0.0,false,
                         SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
              Imf_2_5::FrameBuffer::insert(&fb,"I",(Slice *)&out);
              Imf_2_5::Slice::Slice((Slice *)&out,HALF,b,2,0,1,1,0.0,(bool)uVar45,false);
              Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
              Imf_2_5::Slice::Slice((Slice *)&out,FLOAT,local_158,4,0,1,1,0.0,(bool)uVar45,false);
              Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
              Imf_2_5::InputFile::setFrameBuffer(&in,&fb);
              Imf_2_5::InputFile::readPixels(&in,iVar10);
              std::
              _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                           *)&fb);
              lVar40 = lVar40 + 1;
              iVar10 = iVar10 + 1;
              local_158 = local_158 + lVar33;
              b = b + uVar39 * 2;
              b_00 = b_00 + lVar33;
            } while (lVar40 < (pBVar19->max).y);
          }
          uVar32 = (undefined4)lVar33;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
          std::ostream::flush();
          pHVar18 = Imf_2_5::InputFile::header(&in);
          pBVar19 = Imf_2_5::Header::displayWindow(pHVar18);
          pBVar23 = Imf_2_5::Header::displayWindow(&hdr);
          iVar10 = -(uint)((pBVar23->min).x == (pBVar19->min).x);
          iVar64 = -(uint)((pBVar23->min).y == (pBVar19->min).y);
          auVar60._4_4_ = iVar10;
          auVar60._0_4_ = iVar10;
          auVar60._8_4_ = iVar64;
          auVar60._12_4_ = iVar64;
          iVar10 = movmskpd(uVar32,auVar60);
          if ((iVar10 != 3) ||
             (iVar64 = -(uint)((pBVar23->max).x == (pBVar19->max).x),
             iVar65 = -(uint)((pBVar23->max).y == (pBVar19->max).y), auVar61._4_4_ = iVar64,
             auVar61._0_4_ = iVar64, auVar61._8_4_ = iVar65, auVar61._12_4_ = iVar65,
             iVar64 = movmskpd((int)pBVar23,auVar61), iVar64 != 3)) {
            __assert_fail("in.header().displayWindow() == hdr.displayWindow()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x1c8,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
          pHVar18 = Imf_2_5::InputFile::header(&in);
          pBVar19 = Imf_2_5::Header::dataWindow(pHVar18);
          pBVar23 = Imf_2_5::Header::dataWindow(&hdr);
          iVar64 = -(uint)((pBVar23->min).x == (pBVar19->min).x);
          iVar65 = -(uint)((pBVar23->min).y == (pBVar19->min).y);
          auVar62._4_4_ = iVar64;
          auVar62._0_4_ = iVar64;
          auVar62._8_4_ = iVar65;
          auVar62._12_4_ = iVar65;
          iVar10 = movmskpd(iVar10,auVar62);
          if ((iVar10 != 3) ||
             (iVar10 = -(uint)((pBVar23->max).x == (pBVar19->max).x),
             iVar64 = -(uint)((pBVar23->max).y == (pBVar19->max).y), auVar63._4_4_ = iVar10,
             auVar63._0_4_ = iVar10, auVar63._8_4_ = iVar64, auVar63._12_4_ = iVar64,
             iVar10 = movmskpd((int)pBVar23,auVar63), iVar10 != 3)) {
            __assert_fail("in.header().dataWindow() == hdr.dataWindow()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x1c9,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
          pHVar18 = Imf_2_5::InputFile::header(&in);
          pfVar24 = Imf_2_5::Header::pixelAspectRatio(pHVar18);
          fVar3 = *pfVar24;
          pfVar24 = Imf_2_5::Header::pixelAspectRatio(&hdr);
          if ((fVar3 == *pfVar24) && (!NAN(fVar3) && !NAN(*pfVar24))) {
            pHVar18 = Imf_2_5::InputFile::header(&in);
            pVVar25 = Imf_2_5::Header::screenWindowCenter(pHVar18);
            pVVar26 = Imf_2_5::Header::screenWindowCenter(&hdr);
            if ((pVVar25->x != pVVar26->x) ||
               (((NAN(pVVar25->x) || NAN(pVVar26->x) || (pVVar25->y != pVVar26->y)) ||
                (NAN(pVVar25->y) || NAN(pVVar26->y))))) {
              __assert_fail("in.header().screenWindowCenter() == hdr.screenWindowCenter()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x1cb,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
            pHVar18 = Imf_2_5::InputFile::header(&in);
            pfVar24 = Imf_2_5::Header::screenWindowWidth(pHVar18);
            fVar3 = *pfVar24;
            pfVar24 = Imf_2_5::Header::screenWindowWidth(&hdr);
            if ((fVar3 != *pfVar24) || (NAN(fVar3) || NAN(*pfVar24))) {
              __assert_fail("in.header().screenWindowWidth() == hdr.screenWindowWidth()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x1cc,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
            pHVar18 = Imf_2_5::InputFile::header(&in);
            pLVar15 = Imf_2_5::Header::lineOrder(pHVar18);
            LVar4 = *pLVar15;
            pLVar15 = Imf_2_5::Header::lineOrder(&hdr);
            if (LVar4 != *pLVar15) {
              __assert_fail("in.header().lineOrder() == hdr.lineOrder()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x1cd,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
            pHVar18 = Imf_2_5::InputFile::header(&in);
            pCVar16 = Imf_2_5::Header::compression(pHVar18);
            CVar5 = *pCVar16;
            pCVar16 = Imf_2_5::Header::compression(&hdr);
            if (CVar5 == *pCVar16) {
              pCVar17 = Imf_2_5::Header::channels(&hdr);
              iVar27._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar17);
              pHVar18 = Imf_2_5::InputFile::header(&in);
              pCVar17 = Imf_2_5::Header::channels(pHVar18);
              cVar28._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar17);
              while( true ) {
                pCVar17 = Imf_2_5::Header::channels(&hdr);
                IVar29 = Imf_2_5::ChannelList::end(pCVar17);
                if ((iterator)iVar27._M_node == IVar29._i._M_node) {
                  pHVar18 = Imf_2_5::InputFile::header(&in);
                  pCVar17 = Imf_2_5::Header::channels(pHVar18);
                  CVar30 = Imf_2_5::ChannelList::end(pCVar17);
                  if ((const_iterator)cVar28._M_node != CVar30._i._M_node) {
                    __assert_fail("ii == in.header().channels().end()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                  ,0x1de,
                                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                 );
                  }
                  if (-1 < (int)lVar46) {
                    puVar37 = pi1->_data;
                    phVar44 = ph1->_data;
                    pfVar24 = pf1->_data;
                    uVar34 = 0;
                    pvVar42 = pvVar21;
                    pvVar47 = pvVar22;
                    pvVar50 = pvVar20;
                    do {
                      local_138 = (int)lVar43;
                      if (-1 < local_138) {
                        uVar48 = 0;
                        do {
                          if (puVar37[uVar48] != *(uint *)((long)pvVar50 + uVar48 * 4)) {
                            __assert_fail("pi1[y][x] == pi2[y][x]",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                          ,0x1e4,
                                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                         );
                          }
                          fVar3 = *(float *)((long)&half::_toFloat + (ulong)phVar44[uVar48]._h * 4);
                          pfVar1 = (float *)((long)&half::_toFloat +
                                            (ulong)*(ushort *)((long)pvVar42 + uVar48 * 2) * 4);
                          if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) {
                            __assert_fail("ph1[y][x] == ph2[y][x]",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                          ,0x1e5,
                                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                         );
                          }
                          pfVar1 = (float *)((long)pvVar47 + uVar48 * 4);
                          if ((pfVar24[uVar48] != *pfVar1) || (NAN(pfVar24[uVar48]) || NAN(*pfVar1))
                             ) {
                            __assert_fail("pf1[y][x] == pf2[y][x]",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                          ,0x1e6,
                                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                         );
                          }
                          uVar48 = uVar48 + 1;
                        } while ((uVar39 & 0xffffffff) != uVar48);
                      }
                      uVar34 = uVar34 + 1;
                      pvVar47 = (void *)((long)pvVar47 + uVar39 * 4);
                      pfVar24 = pfVar24 + pf1->_sizeY;
                      pvVar42 = (void *)((long)pvVar42 + uVar39 * 2);
                      phVar44 = phVar44 + ph1->_sizeY;
                      pvVar50 = (void *)((long)pvVar50 + uVar39 * 4);
                      puVar37 = puVar37 + pi1->_sizeY;
                    } while (uVar34 != (iVar7 - iVar8) + 1);
                  }
                  operator_delete__(pvVar22);
                  operator_delete__(pvVar21);
                  operator_delete__(pvVar20);
                  Imf_2_5::InputFile::~InputFile(&in);
                  remove(fileName);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
                  std::ostream::put('x');
                  std::ostream::flush();
                  Imf_2_5::Header::~Header(&hdr);
                  return;
                }
                iVar10 = strcmp((char *)(iVar27._M_node + 1),(char *)(cVar28._M_node + 1));
                if (iVar10 != 0) {
                  __assert_fail("!strcmp (hi.name(), ii.name())",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                ,0x1d5,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                               );
                }
                if (iVar27._M_node[9]._M_color != cVar28._M_node[9]._M_color) break;
                if (*(int *)&iVar27._M_node[9].field_0x4 != *(int *)&cVar28._M_node[9].field_0x4) {
                  __assert_fail("hi.channel().xSampling == ii.channel().xSampling",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                ,0x1d7,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                               );
                }
                if (*(int *)&iVar27._M_node[9]._M_parent != *(int *)&cVar28._M_node[9]._M_parent) {
                  __assert_fail("hi.channel().ySampling == ii.channel().ySampling",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                ,0x1d8,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                               );
                }
                iVar27._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar27._M_node);
                cVar28._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar28._M_node);
              }
              __assert_fail("hi.channel().type == ii.channel().type",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x1d6,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
            __assert_fail("in.header().compression() == hdr.compression()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x1ce,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
          __assert_fail("in.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x1ca,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        iVar10 = strcmp((char *)(iVar27._M_node + 1),(char *)(cVar28._M_node + 1));
        if (iVar10 != 0) {
          __assert_fail("!strcmp (hi.name(), ii.name())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x183,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        if (iVar27._M_node[9]._M_color != cVar28._M_node[9]._M_color) {
          __assert_fail("hi.channel().type == ii.channel().type",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x184,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        if (*(int *)&iVar27._M_node[9].field_0x4 != *(int *)&cVar28._M_node[9].field_0x4) {
          __assert_fail("hi.channel().xSampling == ii.channel().xSampling",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x185,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        if (*(int *)&iVar27._M_node[9]._M_parent != *(int *)&cVar28._M_node[9]._M_parent) break;
        iVar27._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar27._M_node);
        cVar28._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar28._M_node);
      }
      __assert_fail("hi.channel().ySampling == ii.channel().ySampling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x186,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    iVar10 = strcmp((char *)(iVar27._M_node + 1),(char *)(cVar28._M_node + 1));
    if (iVar10 != 0) {
      __assert_fail("!strcmp (hi.name(), ii.name())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x134,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    if (iVar27._M_node[9]._M_color != cVar28._M_node[9]._M_color) {
      __assert_fail("hi.channel().type == ii.channel().type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x135,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    if (*(int *)&iVar27._M_node[9].field_0x4 != *(int *)&cVar28._M_node[9].field_0x4) {
      __assert_fail("hi.channel().xSampling == ii.channel().xSampling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x136,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    if (*(int *)&iVar27._M_node[9]._M_parent != *(int *)&cVar28._M_node[9]._M_parent) break;
    iVar27._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar27._M_node);
    cVar28._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar28._M_node);
  }
  __assert_fail("hi.channel().ySampling == ii.channel().ySampling",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                ,0x137,
                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
               );
}

Assistant:

void
writeRead (const Array2D<unsigned int> &pi1,
           const Array2D<half> &ph1,
           const Array2D<float> &pf1,
           const char fileName[],
           LineOrder lorder,
           int width,
           int height,
           int xSize,
           int ySize,
           int xOffset,
           int yOffset,
           Compression comp,
           LevelMode mode,
	   LevelRoundingMode rmode)
{
    //
    // Write the pixel data in pi1, ph1 and ph2 to a tiled
    // image file using the specified parameters.
    // Read the pixel data back from the file using the scanline
    // interface one scanline at a time, and verify that the data did
    // not change.
    // For MIPMAP and RIPMAP_LEVELS, the lower levels of the images
    // are filled in cropped versions of the level(0,0) image,
    // i.e. no filtering is done.
    //

    cout << "levelMode " << mode <<
	    ", roundingMode " << rmode <<
            ", line order " << lorder <<
            ",\ntileSize " << xSize << "x" << ySize <<
            ", xOffset " << xOffset <<
            ", yOffset "<< yOffset << endl;

    Header hdr ((Box2i (V2i (0, 0),                     // display window
                        V2i (width - 1, height -1))),
                (Box2i (V2i (xOffset, yOffset),         // data window
                        V2i (xOffset + width - 1, yOffset + height - 1))));
    hdr.lineOrder() = lorder;
    hdr.compression() = comp;

    hdr.channels().insert ("I", Channel (IMF::UINT));
    hdr.channels().insert ("H", Channel (IMF::HALF));
    hdr.channels().insert ("F", Channel (IMF::FLOAT));
    
    hdr.setTileDescription(TileDescription(xSize, ySize, mode, rmode));
    {
        FrameBuffer fb; 

        fb.insert ("I",                                       // name
                   Slice (IMF::UINT,                          // type
                          (char *) &pi1[-yOffset][-xOffset],  // base
                          sizeof (pi1[0][0]),                 // xStride
                          sizeof (pi1[0][0]) * width)         // yStride
                  );
                  
        fb.insert ("H",                                       // name
                   Slice (IMF::HALF,                          // type
                          (char *) &ph1[-yOffset][-xOffset],  // base
                          sizeof (ph1[0][0]),                 // xStride
                          sizeof (ph1[0][0]) * width)         // yStride
                  );
                  
        fb.insert ("F",                                       // name
                   Slice (IMF::FLOAT,                              // type
                          (char *) &pf1[-yOffset][-xOffset],  // base
                          sizeof (pf1[0][0]),                 // xStride
                          sizeof (pf1[0][0]) * width)         // yStride
                  );

        cout << " writing" << flush;

        remove (fileName);
        TiledOutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        
        int startTileY = -1;
	int endTileY = -1;
        int dy;

        switch (mode)
        {
          case ONE_LEVEL:
          {
            if (lorder == DECREASING_Y)
            {
                startTileY = out.numYTiles() - 1;
                endTileY = -1;

                dy = -1;
            }        
            else
            {
                startTileY = 0;
                endTileY = out.numYTiles();

                dy = 1;
            }

            for (int tileY = startTileY; tileY != endTileY; tileY += dy)
                for (int tileX = 0; tileX < out.numXTiles(); ++tileX)         
                    out.writeTile (tileX, tileY);
          }
          break;

          case MIPMAP_LEVELS:
          {
            if (lorder == DECREASING_Y)
            {
                endTileY = -1;
                dy = -1;
            }        
            else
            {
                startTileY = 0;
                dy = 1;
            }

            for (int level = 0; level < out.numLevels(); ++level)
            {
                if (lorder == DECREASING_Y)
                    startTileY = out.numYTiles(level) - 1;
                else
                    endTileY = out.numYTiles(level);

                for (int tileY = startTileY; tileY != endTileY; tileY += dy)
                    for (int tileX = 0; tileX < out.numXTiles(level); ++tileX)
                        out.writeTile (tileX, tileY, level);
            }
          }
          break;
          
          case RIPMAP_LEVELS:
          {
            for (int ylevel = 0; ylevel < out.numYLevels(); ++ylevel)
            {               
                if (lorder == DECREASING_Y)
                {
                    startTileY = out.numYTiles(ylevel) - 1;
                    endTileY = -1;

                    dy = -1;
                }        
                else
                {
                    startTileY = 0;
                    endTileY = out.numYTiles(ylevel);

                    dy = 1;
                }

                for (int xlevel = 0; xlevel < out.numXLevels(); ++xlevel)
                {
                    for (int tileY = startTileY; tileY != endTileY;
                         tileY += dy)
                        for (int tileX = 0; tileX < out.numXTiles (xlevel);
                             ++tileX)
                            out.writeTile (tileX, tileY, xlevel, ylevel);
                }
            }
          }
          break;
			case NUM_LEVELMODES:
			default:
				std::cerr << "Invalid tile mode " << int(mode) << std::endl;
				break;
        }
    }

    {
        cout << " reading INCREASING_Y" << flush;

        InputFile in (fileName);

        const Box2i &dw = in.header().dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dwx = dw.min.x;
        int dwy = dw.min.y;

        Array2D<unsigned int> pi2 (h, w);
        Array2D<half>         ph2 (h, w);
        Array2D<float>        pf2 (h, w);

        FrameBuffer fb;

        fb.insert ("I",                             // name
                   Slice (IMF::UINT,                // type
                          (char *) &pi2[-dwy][-dwx],// base
                          sizeof (pi2[0][0]),       // xStride
                          sizeof (pi2[0][0]) * w)   // yStride
                  );

        fb.insert ("H",                             // name
                   Slice (IMF::HALF,                // type
                          (char *) &ph2[-dwy][-dwx],// base
                          sizeof (ph2[0][0]),       // xStride
                          sizeof (ph2[0][0]) * w)   // yStride
                  );

        fb.insert ("F",                             // name
                   Slice (IMF::FLOAT,               // type
                          (char *) &pf2[-dwy][-dwx],// base
                          sizeof (pf2[0][0]),       // xStride
                          sizeof (pf2[0][0]) * w)   // yStride
                  );

        in.setFrameBuffer (fb);
        for (int y = dw.min.y; y <= dw.max.y; ++y)
            in.readPixels (y);

        cout << " comparing" << flush;

        assert (in.header().displayWindow() == hdr.displayWindow());
        assert (in.header().dataWindow() == hdr.dataWindow());
        assert (in.header().pixelAspectRatio() == hdr.pixelAspectRatio());
        assert (in.header().screenWindowCenter() == hdr.screenWindowCenter());
        assert (in.header().screenWindowWidth() == hdr.screenWindowWidth());
        assert (in.header().lineOrder() == hdr.lineOrder());
        assert (in.header().compression() == hdr.compression());

        ChannelList::ConstIterator hi = hdr.channels().begin();
        ChannelList::ConstIterator ii = in.header().channels().begin();

        while (hi != hdr.channels().end())
        {
            assert (!strcmp (hi.name(), ii.name()));
            assert (hi.channel().type == ii.channel().type);
            assert (hi.channel().xSampling == ii.channel().xSampling);
            assert (hi.channel().ySampling == ii.channel().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header().channels().end());

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (pi1[y][x] == pi2[y][x]);
                assert (ph1[y][x] == ph2[y][x]);
                assert (pf1[y][x] == pf2[y][x]);
            }
        }    
    }

    {
        cout << endl << "         reading DECREASING_Y" << flush;

        InputFile in (fileName);

        const Box2i &dw = in.header().dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dwx = dw.min.x;
        int dwy = dw.min.y;

        Array2D<unsigned int> pi2 (h, w);
        Array2D<half>         ph2 (h, w);
        Array2D<float>        pf2 (h, w);

        FrameBuffer fb;

        fb.insert ("I",                             // name
                   Slice (IMF::UINT,                // type
                          (char *) &pi2[-dwy][-dwx],// base
                          sizeof (pi2[0][0]),       // xStride
                          sizeof (pi2[0][0]) * w)   // yStride
                  );

        fb.insert ("H",                             // name
                   Slice (IMF::HALF,                // type
                          (char *) &ph2[-dwy][-dwx],// base
                          sizeof (ph2[0][0]),       // xStride
                          sizeof (ph2[0][0]) * w)   // yStride
                  );

        fb.insert ("F",                             // name
                   Slice (IMF::FLOAT,               // type
                          (char *) &pf2[-dwy][-dwx],// base
                          sizeof (pf2[0][0]),       // xStride
                          sizeof (pf2[0][0]) * w)   // yStride
                  );

        in.setFrameBuffer (fb);
        for (int y = dw.max.y; y >= dw.min.y; --y)
            in.readPixels (y);

        cout << " comparing" << flush;

        assert (in.header().displayWindow() == hdr.displayWindow());
        assert (in.header().dataWindow() == hdr.dataWindow());
        assert (in.header().pixelAspectRatio() == hdr.pixelAspectRatio());
        assert (in.header().screenWindowCenter() == hdr.screenWindowCenter());
        assert (in.header().screenWindowWidth() == hdr.screenWindowWidth());
        assert (in.header().lineOrder() == hdr.lineOrder());
        assert (in.header().compression() == hdr.compression());

        ChannelList::ConstIterator hi = hdr.channels().begin();
        ChannelList::ConstIterator ii = in.header().channels().begin();

        while (hi != hdr.channels().end())
        {
            assert (!strcmp (hi.name(), ii.name()));
            assert (hi.channel().type == ii.channel().type);
            assert (hi.channel().xSampling == ii.channel().xSampling);
            assert (hi.channel().ySampling == ii.channel().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header().channels().end());

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (pi1[y][x] == pi2[y][x]);
                assert (ph1[y][x] == ph2[y][x]);
                assert (pf1[y][x] == pf2[y][x]);
            }
        }
    }

    {
        cout << endl << "         reading INCREASING_Y "
		        "(new frame buffer on every line)" << flush;

        InputFile in (fileName);

        const Box2i &dw = in.header().dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dwx = dw.min.x;
        int dwy = dw.min.y;

        Array2D<unsigned int> pi2 (h, w);
        Array2D<half>         ph2 (h, w);
        Array2D<float>        pf2 (h, w);

        for (int y = dw.min.y; y <= dw.max.y; ++y)
	{
	    FrameBuffer fb;

	    fb.insert ("I",					// name
		       Slice (IMF::UINT,			// type
			      (char *) &pi2[y - dwy][-dwx],	// base
			      sizeof (pi2[0][0]),		// xStride
			      0)				// yStride
		      );

	    fb.insert ("H",					// name
		       Slice (IMF::HALF,			// type
			      (char *) &ph2[y - dwy][-dwx],	// base
			      sizeof (ph2[0][0]),		// xStride
			      0)				// yStride
		      );

	    fb.insert ("F",                     	        // name
		       Slice (IMF::FLOAT,			// type
			      (char *) &pf2[y - dwy][-dwx],	// base
			      sizeof (pf2[0][0]),		// xStride
			      0)				// yStride
		      );

	    in.setFrameBuffer (fb);
            in.readPixels (y);
	}

        cout << " comparing" << flush;

        assert (in.header().displayWindow() == hdr.displayWindow());
        assert (in.header().dataWindow() == hdr.dataWindow());
        assert (in.header().pixelAspectRatio() == hdr.pixelAspectRatio());
        assert (in.header().screenWindowCenter() == hdr.screenWindowCenter());
        assert (in.header().screenWindowWidth() == hdr.screenWindowWidth());
        assert (in.header().lineOrder() == hdr.lineOrder());
        assert (in.header().compression() == hdr.compression());

        ChannelList::ConstIterator hi = hdr.channels().begin();
        ChannelList::ConstIterator ii = in.header().channels().begin();

        while (hi != hdr.channels().end())
        {
            assert (!strcmp (hi.name(), ii.name()));
            assert (hi.channel().type == ii.channel().type);
            assert (hi.channel().xSampling == ii.channel().xSampling);
            assert (hi.channel().ySampling == ii.channel().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header().channels().end());

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (pi1[y][x] == pi2[y][x]);
                assert (ph1[y][x] == ph2[y][x]);
                assert (pf1[y][x] == pf2[y][x]);
            }
        }    
    }

    remove (fileName);
    cout << endl;
}